

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

map * map_new(size_t len)

{
  atomic_uintptr_t *paVar1;
  size_t in_RDI;
  map *dst;
  map *local_8;
  
  local_8 = (map *)calloc(1,0x10);
  if (local_8 == (map *)0x0) {
    local_8 = (map *)0x0;
  }
  else {
    paVar1 = (atomic_uintptr_t *)mmap((void *)0x0,in_RDI << 3,3,0x4022,-1,0);
    local_8->data = paVar1;
    if (local_8->data == (atomic_uintptr_t *)0xffffffffffffffff) {
      free(local_8);
      local_8 = (map *)0x0;
    }
    else {
      local_8->len = in_RDI;
    }
  }
  return local_8;
}

Assistant:

struct map *
map_new(size_t len)
{
    struct map *dst;

    dst = calloc(1, sizeof(struct map));
    if (dst == NULL)
        return (NULL);
#ifdef _WIN32
    dst->data = calloc(len, sizeof(dst->data[0]));
    if(dst->data == NULL) {
        dbg_perror("calloc()");
        free(dst);
        return NULL;
    }
    dst->len = len;
#else
    dst->data = mmap(NULL, len * sizeof(dst->data[0]), PROT_READ | PROT_WRITE,
            MAP_PRIVATE | MAP_NORESERVE | MAP_ANON, -1, 0);
    if (dst->data == MAP_FAILED) {
        dbg_perror("mmap(2)");
        free(dst);
        return (NULL);
    }
    dst->len = len;
#endif

    return (dst);
}